

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O1

iterator __thiscall
spvtools::utils::SmallVector<unsigned_int,2ul>::insert<unsigned_int_const*>
          (SmallVector<unsigned_int,2ul> *this,iterator pos,uint *first,uint *last)

{
  long lVar1;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar2;
  SmallVector<unsigned_int,2ul> *pSVar3;
  iterator puVar4;
  uint *puVar5;
  SmallVector<unsigned_int,2ul> *pSVar6;
  ulong uVar7;
  long lVar8;
  
  pSVar6 = *(SmallVector<unsigned_int,2ul> **)(this + 0x20);
  pSVar3 = pSVar6;
  if (pSVar6 == (SmallVector<unsigned_int,2ul> *)0x0) {
    pSVar3 = this + 0x18;
  }
  lVar8 = (long)last - (long)first >> 2;
  lVar1 = *(long *)pSVar3;
  uVar7 = *(long *)(this + 8) + lVar8;
  if (2 < uVar7 && pSVar6 == (SmallVector<unsigned_int,2ul> *)0x0) {
    SmallVector<unsigned_int,_2UL>::MoveToLargeData((SmallVector<unsigned_int,_2UL> *)this);
  }
  pvVar2 = *(vector<unsigned_int,std::allocator<unsigned_int>> **)(this + 0x20);
  if (pvVar2 == (vector<unsigned_int,std::allocator<unsigned_int>> *)0x0) {
    puVar4 = (iterator)(*(long *)(this + 0x18) + *(long *)(this + 8) * 4 + -4);
    if (pos <= puVar4) {
      puVar5 = (uint *)(*(long *)(this + 0x18) + uVar7 * 4);
      do {
        puVar5 = puVar5 + -1;
        *puVar5 = *puVar4;
        puVar4 = puVar4 + -1;
      } while (pos <= puVar4);
    }
    puVar5 = pos;
    if (first != last) {
      do {
        *puVar5 = *first;
        first = first + 1;
        puVar5 = puVar5 + 1;
      } while (first != last);
    }
    *(long *)(this + 8) = *(long *)(this + 8) + lVar8;
  }
  else {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_range_insert<unsigned_int_const*>
              (pvVar2,(long)pos + (*(long *)pvVar2 - lVar1),first,last);
    pSVar6 = this + 0x18;
    if (*(SmallVector<unsigned_int,2ul> **)(this + 0x20) != (SmallVector<unsigned_int,2ul> *)0x0) {
      pSVar6 = *(SmallVector<unsigned_int,2ul> **)(this + 0x20);
    }
    pos = (iterator)((long)pos + (*(long *)pSVar6 - lVar1));
  }
  return pos;
}

Assistant:

iterator insert(iterator pos, InputIt first, InputIt last) {
    size_t element_idx = (pos - begin());
    size_t num_of_new_elements = std::distance(first, last);
    size_t new_size = size_ + num_of_new_elements;
    if (!large_data_ && new_size > small_size) {
      MoveToLargeData();
    }

    if (large_data_) {
      typename std::vector<T>::iterator new_pos =
          large_data_->begin() + element_idx;
      large_data_->insert(new_pos, first, last);
      return begin() + element_idx;
    }

    // Move |pos| and all of the elements after it over |num_of_new_elements|
    // places.  We start at the end and work backwards, to make sure we do not
    // overwrite data that we have not moved yet.
    for (iterator i = begin() + new_size - 1, j = end() - 1; j >= pos;
         --i, --j) {
      if (i >= begin() + size_) {
        new (i) T(std::move(*j));
      } else {
        *i = std::move(*j);
      }
    }

    // Copy the new elements into position.
    iterator p = pos;
    for (; first != last; ++p, ++first) {
      if (p >= small_data_ + size_) {
        new (p) T(*first);
      } else {
        *p = *first;
      }
    }

    // Update the size.
    size_ += num_of_new_elements;
    return pos;
  }